

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_16x64_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  TX_TYPE in_CL;
  int in_EDX;
  __m128i *in_RSI;
  long in_RDI;
  int i_1;
  int i;
  int num_col;
  int lr_flip;
  int ud_flip;
  int bitrow;
  int bitcol;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i *outcoeff128;
  __m128i in [256];
  int in_stack_000030e4;
  int in_stack_000030e8;
  int8_t in_stack_000030ef;
  __m128i *in_stack_000030f0;
  __m128i *in_stack_000030f8;
  int shift_00;
  int iVar1;
  undefined4 uVar2;
  int local_1058;
  int local_1054;
  int local_1050;
  int local_104c;
  undefined4 local_1048;
  undefined4 local_1044;
  int local_1040;
  int local_103c;
  char *local_1038;
  __m128i *local_1030;
  longlong local_1028 [98];
  int in_stack_fffffffffffff2e8;
  int in_stack_fffffffffffff2ec;
  __m128i *in_stack_fffffffffffff2f0;
  __m128i *in_stack_fffffffffffff2f8;
  
  local_1038 = av1_fwd_txfm_shift_ls[0x11];
  local_1030 = in_RSI;
  local_103c = get_txw_idx('\x11');
  local_1040 = get_txh_idx('\x11');
  local_1044 = 0x10;
  local_1048 = 0x40;
  local_104c = (int)av1_fwd_cos_bit_col[local_103c][local_1040];
  local_1050 = (int)av1_fwd_cos_bit_row[local_103c][local_1040];
  get_flip_cfg(in_CL,&local_1054,&local_1058);
  uVar2 = 4;
  for (iVar1 = 0; iVar1 < 0x40; iVar1 = iVar1 + 4) {
    load_buffer_4x4((int16_t *)(in_RDI + (long)(iVar1 * in_EDX) * 2),
                    (__m128i *)(local_1028 + (long)(iVar1 << 2) * 2),4,local_1054,local_1058,
                    (int)*local_1038);
    load_buffer_4x4((int16_t *)(in_RDI + (long)((iVar1 + 1) * in_EDX) * 2),
                    (__m128i *)(local_1028 + (long)((iVar1 + 1) * 4) * 2),4,local_1054,local_1058,
                    (int)*local_1038);
    load_buffer_4x4((int16_t *)(in_RDI + (long)((iVar1 + 2) * in_EDX) * 2),
                    (__m128i *)(local_1028 + (long)((iVar1 + 2) * 4) * 2),4,local_1054,local_1058,
                    (int)*local_1038);
    load_buffer_4x4((int16_t *)(in_RDI + (long)((iVar1 + 3) * in_EDX) * 2),
                    (__m128i *)(local_1028 + (long)((iVar1 + 3) * 4) * 2),4,local_1054,local_1058,
                    (int)*local_1038);
  }
  for (shift_00 = 0; shift_00 < 4; shift_00 = shift_00 + 1) {
    av1_fdct64_sse4_1(in_stack_000030f8,in_stack_000030f0,in_stack_000030ef,in_stack_000030e8,
                      in_stack_000030e4);
  }
  col_txfm_16x16_rounding((__m128i *)CONCAT44(uVar2,iVar1),shift_00);
  col_txfm_16x16_rounding((__m128i *)CONCAT44(uVar2,iVar1),shift_00);
  col_txfm_16x16_rounding((__m128i *)CONCAT44(uVar2,iVar1),shift_00);
  col_txfm_16x16_rounding((__m128i *)CONCAT44(uVar2,iVar1),shift_00);
  transpose_8nx8n(local_1030,(__m128i *)local_1028,0x10,0x20);
  fdct16x16_sse4_1(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,in_stack_fffffffffffff2ec,
                   in_stack_fffffffffffff2e8);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x64_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[256];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X64];
  const int txw_idx = get_txw_idx(TX_16X64);
  const int txh_idx = get_txh_idx(TX_16X64);
  const int txfm_size_col = tx_size_wide[TX_16X64];
  const int txfm_size_row = tx_size_high[TX_16X64];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  const int num_col = txfm_size_col >> 2;
  // col tranform
  for (int i = 0; i < txfm_size_row; i += num_col) {
    load_buffer_4x4(input + (i + 0) * stride, in + (i + 0) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + (i + 1) * stride, in + (i + 1) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + (i + 2) * stride, in + (i + 2) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + (i + 3) * stride, in + (i + 3) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
  }

  for (int i = 0; i < num_col; i++) {
    av1_fdct64_sse4_1(in + i, outcoeff128 + i, bitcol, num_col, num_col);
  }

  col_txfm_16x16_rounding(outcoeff128, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 64, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 128, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 192, -shift[1]);

  transpose_8nx8n(outcoeff128, in, txfm_size_col, 32);
  fdct16x16_sse4_1(in, outcoeff128, bitrow, 8);
  (void)bd;
}